

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall wabt::SharedValidator::OnMemorySize(SharedValidator *this,Location *loc)

{
  Result rhs;
  Var local_88;
  Enum local_3c;
  undefined1 local_38 [8];
  MemoryType mt;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  mt.limits._16_8_ = loc;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  MemoryType::MemoryType((MemoryType *)local_38);
  this->expr_loc_ = (Location *)mt.limits._16_8_;
  Var::Var(&local_88,0,(Location *)mt.limits._16_8_);
  local_3c = (Enum)CheckMemoryIndex(this,&local_88,(MemoryType *)local_38);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_3c);
  Var::~Var(&local_88);
  rhs = TypeChecker::OnMemorySize(&this->typechecker_,(Limits *)local_38);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnMemorySize(const Location& loc) {
  Result result = Result::Ok;
  MemoryType mt;
  expr_loc_ = &loc;
  result |= CheckMemoryIndex(Var(0, loc), &mt);
  result |= typechecker_.OnMemorySize(mt.limits);
  return result;
}